

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.cpp
# Opt level: O3

void __thiscall
Assimp::RAWImporter::InternReadFile
          (RAWImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *this_00;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint uVar5;
  pointer pMVar6;
  aiScene *paVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  GroupInformation *outGroup;
  undefined4 extraout_var;
  char *__s1;
  Logger *this_01;
  ulong uVar12;
  undefined8 uVar13;
  aiNode *paVar14;
  aiMesh **ppaVar15;
  aiNode **__s;
  aiMaterial **ppaVar16;
  uint *puVar17;
  aiMesh *paVar18;
  aiVector3D *__s_00;
  aiColor4D *__s_01;
  ulong *puVar19;
  aiFace *paVar20;
  uint *puVar21;
  aiMaterial *this_02;
  long *plVar22;
  runtime_error *prVar23;
  long lVar24;
  size_type *psVar25;
  ulong uVar26;
  pointer pMVar27;
  MeshInformation *mesh;
  iterator iVar28;
  iterator iVar29;
  aiFace *f;
  byte *pbVar30;
  aiFace *paVar31;
  pointer pGVar32;
  aiNode **ppaVar33;
  ulong uVar34;
  float data [12];
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  outGroups;
  vector<char,_std::allocator<char>_> mBuffer2;
  aiString s;
  char line [4096];
  pointer local_1530;
  undefined1 local_1520 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1510;
  IOStream *local_1500;
  undefined1 local_14f8 [8];
  float fStack_14f0;
  undefined4 uStack_14ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_14e8;
  float local_14d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_14d4;
  float local_14cc;
  pointer local_14c0;
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  local_14b8;
  aiNode **local_14a0;
  aiNode **local_1498;
  aiScene *local_1490;
  pointer local_1488;
  uint *local_1480;
  vector<char,_std::allocator<char>_> local_1478;
  pointer local_1458;
  aiColor4D **local_1450;
  aiMaterial **local_1448;
  undefined1 local_1440 [12];
  float fStack_1434;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1430;
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  local_1420;
  pointer local_1408;
  pointer local_13f8;
  GroupInformation local_1038 [73];
  
  paVar4 = &local_1038[0].name.field_2;
  local_1490 = pScene;
  local_1038[0].name._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"rb","");
  iVar9 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,local_1038[0].name._M_dataplus._M_p);
  local_1500 = (IOStream *)CONCAT44(extraout_var,iVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0].name._M_dataplus._M_p != paVar4) {
    operator_delete(local_1038[0].name._M_dataplus._M_p,
                    local_1038[0].name.field_2._M_allocated_capacity + 1);
  }
  if (local_1500 == (IOStream *)0x0) {
    prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1440,
                   "Failed to open RAW file ",pFile);
    plVar22 = (long *)std::__cxx11::string::append(local_1440);
    local_1038[0].name._M_dataplus._M_p = (pointer)*plVar22;
    psVar25 = (size_type *)(plVar22 + 2);
    if ((size_type *)local_1038[0].name._M_dataplus._M_p == psVar25) {
      local_1038[0].name.field_2._0_8_ = *psVar25;
      local_1038[0].name.field_2._8_8_ = plVar22[3];
      local_1038[0].name._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_1038[0].name.field_2._0_8_ = *psVar25;
    }
    local_1038[0].name._M_string_length = plVar22[1];
    *plVar22 = (long)psVar25;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    std::runtime_error::runtime_error(prVar23,(string *)local_1038);
    *(undefined ***)prVar23 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1478.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1478.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1478.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(local_1500,&local_1478,FORBID_EMPTY);
  pbVar30 = (byte *)local_1478.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_1440._0_8_ = &local_1430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1440,"<default>","");
  GroupInformation::GroupInformation(local_1038,(string *)local_1440);
  std::
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  ::vector(&local_14b8,1,local_1038,(allocator_type *)local_14f8);
  std::
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  ::~vector(&local_1038[0].meshes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0].name._M_dataplus._M_p != paVar4) {
    operator_delete(local_1038[0].name._M_dataplus._M_p,
                    local_1038[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1440._0_8_ != &local_1430) {
    operator_delete((void *)local_1440._0_8_,local_1430._M_allocated_capacity + 1);
  }
  bVar8 = *pbVar30;
  if (bVar8 != 0) {
    local_1530 = local_14b8.
                 super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    do {
      pGVar32 = local_14b8.
                super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      __s1 = (char *)local_1038;
      for (lVar24 = 0;
          ((0xd < bVar8 || ((0x3401U >> (bVar8 & 0x1f) & 1) == 0)) && (lVar24 != 0x1000));
          lVar24 = lVar24 + 1) {
        *(byte *)((long)&local_1038[0].name._M_dataplus._M_p + lVar24) = bVar8;
        bVar8 = pbVar30[lVar24 + 1];
      }
      *(undefined1 *)((long)&local_1038[0].name._M_dataplus._M_p + lVar24) = 0;
      pbVar30 = pbVar30 + lVar24;
      while ((*pbVar30 < 0xe && ((0x3400U >> (*pbVar30 & 0x1f) & 1) != 0))) {
        pbVar30 = pbVar30 + 1;
      }
      while( true ) {
        bVar8 = *(byte *)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p;
        uVar12 = (ulong)bVar8;
        if (0x20 < uVar12) break;
        if ((0x100000200U >> (uVar12 & 0x3f) & 1) == 0) {
          if ((0x3401UL >> (uVar12 & 0x3f) & 1) != 0) goto LAB_006044dd;
          break;
        }
        __s1 = (char *)((long)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p + 1);
      }
      if ((((byte)(bVar8 - 0x30) < 10) || (bVar8 == 0x2b)) || (bVar8 == 0x2d)) {
        lVar24 = 0;
        do {
          while( true ) {
            bVar8 = *(byte *)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p;
            uVar12 = (ulong)bVar8;
            if (0x20 < uVar12) break;
            if ((0x100000200U >> (uVar12 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar12 & 0x3f) & 1) == 0) break;
LAB_00604567:
              if (((int)lVar24 == 9) || ((int)lVar24 == 0xc)) goto LAB_00604577;
              this_01 = DefaultLogger::get();
              Logger::error(this_01,"A line may have either 9 or 12 floats and an optional texture")
              ;
              goto LAB_006044dd;
            }
            __s1 = (char *)((long)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p + 1);
          }
          if (((9 < (byte)(bVar8 - 0x30)) && (bVar8 != 0x2b)) && (bVar8 != 0x2d)) goto LAB_00604567;
          __s1 = fast_atoreal_move<float>(__s1,(float *)(local_14f8 + lVar24 * 4),true);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0xc);
        lVar24 = 0xc;
LAB_00604577:
        bVar8 = *(byte *)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p;
        iVar9 = (int)lVar24;
        if ((bVar8 < 0xe) && ((0x3401U >> (bVar8 & 0x1f) & 1) != 0)) {
          __s1 = "";
          if (iVar9 == 9) {
            __s1 = "%default%";
          }
          uVar12 = (ulong)((uint)(iVar9 == 9) * 9);
        }
        else {
          uVar12 = 0;
          while ((0x20 < bVar8 || ((0x100003601U >> ((ulong)bVar8 & 0x3f) & 1) == 0))) {
            bVar8 = *(byte *)((long)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p +
                             uVar12 + 1);
            uVar12 = uVar12 + 1;
          }
        }
        pMVar6 = (local_1530->meshes).
                 super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pMVar27 = (local_1530->meshes).
                       super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                       ._M_impl.super__Vector_impl_data._M_start; pMVar27 != pMVar6;
            pMVar27 = pMVar27 + 1) {
          if (((pMVar27->name)._M_string_length == (uVar12 & 0xffffffff)) &&
             (((int)uVar12 == 0 ||
              (iVar10 = strcmp(__s1,(pMVar27->name)._M_dataplus._M_p), iVar10 == 0))))
          goto LAB_006046d4;
        }
        local_1520._0_8_ = &local_1510;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1520,__s1,
                   (char *)((long)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p +
                           (uVar12 & 0xffffffff)));
        MeshInformation::MeshInformation((MeshInformation *)local_1440,(string *)local_1520);
        std::
        vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
        ::emplace_back<Assimp::RAWImporter::MeshInformation>
                  (&local_1530->meshes,(MeshInformation *)local_1440);
        if (local_1408 != (pointer)0x0) {
          operator_delete(local_1408,(long)local_13f8 - (long)local_1408);
        }
        if (local_1420.
            super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1420.
                          super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1420.
                                super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1420.
                                super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1440._0_8_ != &local_1430) {
          operator_delete((void *)local_1440._0_8_,local_1430._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1520._0_8_ != &local_1510) {
          operator_delete((void *)local_1520._0_8_,local_1510._M_allocated_capacity + 1);
        }
        pMVar27 = (local_1530->meshes).
                  super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_006046d4:
        if (iVar9 == 0xc) {
          local_1440._0_8_ = local_14f8;
          local_1440._8_4_ = fStack_14f0;
          fStack_1434 = 1.0;
          this_00 = &pMVar27->colors;
          iVar28._M_current =
               (pMVar27->colors).
               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar28._M_current ==
              (pMVar27->colors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>const&>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)this_00,iVar28,
                       (aiColor4t<float> *)local_1440);
            iVar28._M_current =
                 (pMVar27->colors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            (iVar28._M_current)->r = (float)local_14f8._0_4_;
            (iVar28._M_current)->g = (float)local_14f8._4_4_;
            (iVar28._M_current)->b = fStack_14f0;
            (iVar28._M_current)->a = 1.0;
            iVar28._M_current =
                 (pMVar27->colors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (pMVar27->colors).
            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current;
          }
          if (iVar28._M_current ==
              (pMVar27->colors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>const&>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)this_00,iVar28,
                       (aiColor4t<float> *)local_1440);
            iVar28._M_current =
                 (pMVar27->colors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            (iVar28._M_current)->r = (float)local_1440._0_4_;
            (iVar28._M_current)->g = (float)local_1440._4_4_;
            (iVar28._M_current)->b = (float)local_1440._8_4_;
            (iVar28._M_current)->a = fStack_1434;
            iVar28._M_current =
                 (pMVar27->colors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (pMVar27->colors).
            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current;
          }
          if (iVar28._M_current ==
              (pMVar27->colors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>const&>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)this_00,iVar28,
                       (aiColor4t<float> *)local_1440);
          }
          else {
            (iVar28._M_current)->r = (float)local_1440._0_4_;
            (iVar28._M_current)->g = (float)local_1440._4_4_;
            (iVar28._M_current)->b = (float)local_1440._8_4_;
            (iVar28._M_current)->a = fStack_1434;
            ppaVar2 = &(pMVar27->colors).
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar2 = *ppaVar2 + 1;
          }
          pvVar1 = &pMVar27->vertices;
          local_1520._8_4_ = aStack_14e8._M_allocated_capacity._4_4_;
          iVar29._M_current =
               (pMVar27->vertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar29._M_current ==
              (pMVar27->vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar1,iVar29,
                       (aiVector3t<float> *)local_1520);
            iVar29._M_current =
                 (pMVar27->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            (iVar29._M_current)->z = (float)aStack_14e8._M_allocated_capacity._4_4_;
            (iVar29._M_current)->x = (float)uStack_14ec;
            (iVar29._M_current)->y = (float)aStack_14e8._0_4_;
            iVar29._M_current =
                 (pMVar27->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (pMVar27->vertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar29._M_current;
          }
          local_1520._0_8_ = aStack_14e8._8_8_;
          local_1520._8_4_ = local_14d8;
          if (iVar29._M_current ==
              (pMVar27->vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar1,iVar29,
                       (aiVector3t<float> *)local_1520);
            iVar29._M_current =
                 (pMVar27->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            (iVar29._M_current)->z = local_14d8;
            (iVar29._M_current)->x = (float)aStack_14e8._8_4_;
            (iVar29._M_current)->y = (float)aStack_14e8._12_4_;
            iVar29._M_current =
                 (pMVar27->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (pMVar27->vertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar29._M_current;
          }
          local_1520._0_8_ = local_14d4;
          local_1520._8_4_ = local_14cc;
          if (iVar29._M_current ==
              (pMVar27->vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar1,iVar29,
                       (aiVector3t<float> *)local_1520);
          }
          else {
            (iVar29._M_current)->z = local_14cc;
            uVar13 = local_14d4;
LAB_00604acc:
            *(undefined8 *)iVar29._M_current = uVar13;
            ppaVar3 = &(pMVar27->vertices).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar3 = *ppaVar3 + 1;
          }
        }
        else {
          pvVar1 = &pMVar27->vertices;
          local_1440._0_8_ = local_14f8;
          local_1440._8_4_ = fStack_14f0;
          iVar29._M_current =
               (pMVar27->vertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar29._M_current ==
              (pMVar27->vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar1,iVar29,
                       (aiVector3t<float> *)local_1440);
            iVar29._M_current =
                 (pMVar27->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            (iVar29._M_current)->z = fStack_14f0;
            (iVar29._M_current)->x = (float)local_14f8._0_4_;
            (iVar29._M_current)->y = (float)local_14f8._4_4_;
            iVar29._M_current =
                 (pMVar27->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (pMVar27->vertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar29._M_current;
          }
          local_1440._8_4_ = aStack_14e8._M_allocated_capacity._4_4_;
          if (iVar29._M_current ==
              (pMVar27->vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar1,iVar29,
                       (aiVector3t<float> *)local_1440);
            iVar29._M_current =
                 (pMVar27->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            (iVar29._M_current)->z = (float)aStack_14e8._M_allocated_capacity._4_4_;
            (iVar29._M_current)->x = (float)uStack_14ec;
            (iVar29._M_current)->y = (float)aStack_14e8._0_4_;
            iVar29._M_current =
                 (pMVar27->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (pMVar27->vertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar29._M_current;
          }
          local_1440._0_8_ = aStack_14e8._8_8_;
          local_1440._8_4_ = local_14d8;
          if (iVar29._M_current !=
              (pMVar27->vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            (iVar29._M_current)->z = local_14d8;
            uVar13 = aStack_14e8._8_8_;
            goto LAB_00604acc;
          }
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar1,iVar29,
                     (aiVector3t<float> *)local_1440);
        }
      }
      else {
        uVar26 = 0;
        while ((0x20 < (byte)uVar12 || ((0x100003601U >> (uVar12 & 0x3f) & 1) == 0))) {
          lVar24 = uVar26 + 1;
          uVar26 = uVar26 + 1;
          uVar12 = (ulong)*(byte *)((long)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p +
                                   lVar24);
        }
        if (local_14b8.
            super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_14b8.
            super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_1530 = local_14b8.
                       super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (((uVar26 & 0xffffffff) == (local_1530->name)._M_string_length) &&
               (iVar9 = strcmp(__s1,(local_1530->name)._M_dataplus._M_p), iVar9 == 0))
            goto LAB_006044dd;
            local_1530 = local_1530 + 1;
          } while (local_1530 != pGVar32);
        }
        local_14f8 = (undefined1  [8])&aStack_14e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_14f8,__s1,
                   (char *)((long)&(((GroupInformation *)__s1)->name)._M_dataplus._M_p +
                           (uVar26 & 0xffffffff)));
        GroupInformation::GroupInformation((GroupInformation *)local_1440,(string *)local_14f8);
        std::
        vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
        ::emplace_back<Assimp::RAWImporter::GroupInformation>
                  (&local_14b8,(GroupInformation *)local_1440);
        std::
        vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
        ::~vector(&local_1420);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1440._0_8_ != &local_1430) {
          operator_delete((void *)local_1440._0_8_,local_1430._M_allocated_capacity + 1);
        }
        if (local_14f8 != (undefined1  [8])&aStack_14e8) {
          operator_delete((void *)local_14f8,
                          CONCAT44(aStack_14e8._M_allocated_capacity._4_4_,
                                   aStack_14e8._M_allocated_capacity._0_4_) + 1);
        }
        local_1530 = local_14b8.
                     super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
      }
LAB_006044dd:
      bVar8 = *pbVar30;
    } while (bVar8 != 0);
  }
  paVar14 = (aiNode *)operator_new(0x478);
  paVar7 = local_1490;
  aiNode::aiNode(paVar14);
  paVar7->mRootNode = paVar14;
  (paVar14->mName).length = 9;
  builtin_strncpy((paVar14->mName).data,"<RawRoot>",10);
  local_14c0 = local_14b8.
               super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  for (pGVar32 = local_14b8.
                 super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pGVar32 !=
      local_14b8.
      super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish; pGVar32 = pGVar32 + 1) {
    if ((pGVar32->meshes).
        super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pGVar32->meshes).
        super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar17 = &paVar7->mRootNode->mNumChildren;
      *puVar17 = *puVar17 + 1;
      paVar7->mNumMeshes =
           paVar7->mNumMeshes +
           (int)((ulong)((long)(pGVar32->meshes).
                               super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pGVar32->meshes).
                              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
    }
  }
  if ((ulong)paVar7->mNumMeshes == 0) {
    prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1440._0_8_ = &local_1430;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1440,"RAW: No meshes loaded. The file seems to be corrupt or empty.",
               "");
    std::runtime_error::runtime_error(prVar23,(string *)local_1440);
    *(undefined ***)prVar23 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ppaVar15 = (aiMesh **)operator_new__((ulong)paVar7->mNumMeshes << 3);
  ppaVar33 = &paVar7->mRootNode;
  paVar7->mMeshes = ppaVar15;
  paVar14 = paVar7->mRootNode;
  if ((ulong)paVar14->mNumChildren == 1) {
    paVar14->mNumChildren = 0;
    __s = ppaVar33;
  }
  else {
    __s = (aiNode **)operator_new__((ulong)paVar14->mNumChildren << 3);
    memset(__s,0,(ulong)paVar14->mNumChildren << 3);
    paVar14->mChildren = __s;
  }
  paVar7->mNumMaterials = paVar7->mNumMeshes;
  ppaVar16 = (aiMaterial **)operator_new__((ulong)paVar7->mNumMeshes << 3);
  paVar7->mMaterials = ppaVar16;
  if (local_14b8.
      super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
      ._M_impl.super__Vector_impl_data._M_start != local_14c0) {
    uVar5 = 0;
    pGVar32 = local_14b8.
              super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_14a0 = ppaVar33;
    local_1498 = __s;
    do {
      if ((pGVar32->meshes).
          super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pGVar32->meshes).
          super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if ((*ppaVar33)->mNumChildren == 0) {
          paVar14 = *__s;
        }
        else {
          paVar14 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar14);
          *__s = paVar14;
          paVar14->mParent = *ppaVar33;
        }
        uVar12 = (pGVar32->name)._M_string_length;
        if (uVar12 < 0x400) {
          (paVar14->mName).length = (ai_uint32)uVar12;
          memcpy((paVar14->mName).data,(pGVar32->name)._M_dataplus._M_p,uVar12);
          (paVar14->mName).data[uVar12] = '\0';
        }
        uVar11 = (int)((long)(pGVar32->meshes).
                             super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pGVar32->meshes).
                             super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
        paVar14->mNumMeshes = uVar11;
        puVar17 = (uint *)operator_new__((ulong)uVar11 << 2);
        paVar14->mMeshes = puVar17;
        pMVar27 = (pGVar32->meshes).
                  super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1458 = (pGVar32->meshes).
                     super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        local_1488 = pGVar32;
        if (pMVar27 != local_1458) {
          do {
            if ((pMVar27->vertices).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start ==
                (pMVar27->vertices).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              __assert_fail("!(*it2).vertices.empty()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                            ,0x114,
                            "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                           );
            }
            *puVar17 = uVar5;
            local_1480 = puVar17;
            local_1448 = ppaVar16;
            paVar18 = (aiMesh *)operator_new(0x520);
            paVar18->mNumVertices = 0;
            paVar18->mNumFaces = 0;
            memset(&paVar18->mVertices,0,0xcc);
            paVar18->mBones = (aiBone **)0x0;
            paVar18->mMaterialIndex = 0;
            (paVar18->mName).length = 0;
            (paVar18->mName).data[0] = '\0';
            memset((paVar18->mName).data + 1,0x1b,0x3ff);
            paVar18->mNumAnimMeshes = 0;
            paVar18->mAnimMeshes = (aiAnimMesh **)0x0;
            paVar18->mMethod = 0;
            (paVar18->mAABB).mMin.x = 0.0;
            (paVar18->mAABB).mMin.y = 0.0;
            (paVar18->mAABB).mMin.z = 0.0;
            (paVar18->mAABB).mMax.x = 0.0;
            (paVar18->mAABB).mMax.y = 0.0;
            (paVar18->mAABB).mMax.z = 0.0;
            local_1450 = paVar18->mColors;
            memset(local_1450,0,0xa0);
            local_1490->mMeshes[uVar5] = paVar18;
            paVar18->mMaterialIndex = uVar5;
            paVar18->mPrimitiveTypes = 4;
            uVar34 = ((long)(pMVar27->vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pMVar27->vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            uVar11 = (uint)uVar34;
            paVar18->mNumVertices = uVar11;
            uVar26 = uVar34 & 0xffffffff;
            uVar12 = uVar26 * 0xc;
            __s_00 = (aiVector3D *)operator_new__(uVar12);
            if (uVar26 != 0) {
              memset(__s_00,0,((uVar12 - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar18->mVertices = __s_00;
            memcpy(__s_00,(pMVar27->vertices).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,uVar12);
            lVar24 = (long)(pMVar27->colors).
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pMVar27->colors).
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            if (lVar24 != 0) {
              if (lVar24 >> 4 != uVar26) {
                __assert_fail("(*it2).colors.size() == mesh->mNumVertices",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                              ,0x124,
                              "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                             );
              }
              __s_01 = (aiColor4D *)operator_new__(uVar26 << 4);
              if (uVar11 != 0) {
                memset(__s_01,0,uVar26 << 4);
              }
              *local_1450 = __s_01;
              memcpy(__s_01,(pMVar27->colors).
                            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(uVar34 & 0xffffffff) << 4);
            }
            if (0x55555555 < uVar11 * -0x55555555) {
              __assert_fail("0 == mesh->mNumVertices % 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                            ,299,
                            "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                           );
            }
            uVar26 = uVar26 / 3;
            paVar18->mNumFaces = (uint)uVar26;
            puVar19 = (ulong *)operator_new__(uVar26 * 0x10 + 8);
            puVar17 = local_1480;
            __s = local_1498;
            *puVar19 = uVar26;
            paVar31 = (aiFace *)(puVar19 + 1);
            if (uVar11 < 3) {
              paVar18->mFaces = paVar31;
            }
            else {
              paVar20 = paVar31;
              do {
                paVar20->mNumIndices = 0;
                paVar20->mIndices = (uint *)0x0;
                paVar20 = paVar20 + 1;
              } while (paVar20 != paVar31 + uVar26);
              paVar18->mFaces = paVar31;
              if (2 < uVar11) {
                iVar9 = 0;
                do {
                  paVar31->mNumIndices = 3;
                  puVar21 = (uint *)operator_new__(0xc);
                  paVar20 = paVar31 + 1;
                  paVar31->mIndices = puVar21;
                  lVar24 = 0;
                  do {
                    paVar31->mIndices[lVar24] = iVar9 + (int)lVar24;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 3);
                  iVar9 = iVar9 + 3;
                  paVar31 = paVar20;
                } while (paVar20 != (aiFace *)(puVar19 + uVar26 * 2 + 1));
              }
            }
            this_02 = (aiMaterial *)operator_new(0x10);
            aiMaterial::aiMaterial(this_02);
            local_14f8 = (undefined1  [8])0x3f8000003f800000;
            fStack_14f0 = 1.0;
            uStack_14ec = 0x3f800000;
            iVar9 = std::__cxx11::string::compare((char *)pMVar27);
            pGVar32 = local_1488;
            ppaVar33 = local_14a0;
            if (iVar9 == 0) {
              fStack_14f0 = 0.6;
              local_14f8 = (undefined1  [8])0x3f19999a3f19999a;
            }
            else if ((pMVar27->name)._M_string_length != 0) {
              local_1440._0_8_ = local_1440._0_8_ & 0xffffff0000000000;
              memset(local_1440 + 5,0x1b,0x3ff);
              uVar12 = (pMVar27->name)._M_string_length;
              if (uVar12 < 0x400) {
                local_1440._0_4_ = (int)uVar12;
                memcpy(local_1440 + 4,(pMVar27->name)._M_dataplus._M_p,uVar12);
                local_1440[uVar12 + 4] = 0;
              }
              aiMaterial::AddProperty(this_02,(aiString *)local_1440,"$tex.file",1,0);
            }
            aiMaterial::AddBinaryProperty(this_02,local_14f8,0x10,"$clr.diffuse",0,0,aiPTI_Float);
            puVar17 = puVar17 + 1;
            uVar5 = uVar5 + 1;
            *local_1448 = this_02;
            ppaVar16 = local_1448 + 1;
            pMVar27 = pMVar27 + 1;
          } while (pMVar27 != local_1458);
        }
      }
      pGVar32 = pGVar32 + 1;
    } while (pGVar32 != local_14c0);
  }
  std::
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  ::~vector(&local_14b8);
  if ((byte *)local_1478.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_1478.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1478.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1478.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*local_1500->_vptr_IOStream[1])();
  return;
}

Assistant:

void RAWImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open RAW file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // list of groups loaded from the file
    std::vector< GroupInformation > outGroups(1,GroupInformation("<default>"));
    std::vector< GroupInformation >::iterator curGroup = outGroups.begin();

    // now read all lines
    char line[4096];
    while (GetNextLine(buffer,line))
    {
        // if the line starts with a non-numeric identifier, it marks
        // the beginning of a new group
        const char* sz = line;SkipSpaces(&sz);
        if (IsLineEnd(*sz))continue;
        if (!IsNumeric(*sz))
        {
            const char* sz2 = sz;
            while (!IsSpaceOrNewLine(*sz2))++sz2;
            const unsigned int length = (unsigned int)(sz2-sz);

            // find an existing group with this name
            for (std::vector< GroupInformation >::iterator it = outGroups.begin(), end = outGroups.end();
                it != end;++it)
            {
                if (length == (*it).name.length() && !::strcmp(sz,(*it).name.c_str()))
                {
                    curGroup = it;sz2 = NULL;
                    break;
                }
            }
            if (sz2)
            {
                outGroups.push_back(GroupInformation(std::string(sz,length)));
                curGroup = outGroups.end()-1;
            }
        }
        else
        {
            // there can be maximally 12 floats plus an extra texture file name
            float data[12];
            unsigned int num;
            for (num = 0; num < 12;++num)
            {
                if(!SkipSpaces(&sz) || !IsNumeric(*sz))break;
                sz = fast_atoreal_move<float>(sz,data[num]);
            }
            if (num != 12 && num != 9)
            {
                ASSIMP_LOG_ERROR("A line may have either 9 or 12 floats and an optional texture");
                continue;
            }

            MeshInformation* output = NULL;

            const char* sz2 = sz;
            unsigned int length;
            if (!IsLineEnd(*sz))
            {
                while (!IsSpaceOrNewLine(*sz2))++sz2;
                length = (unsigned int)(sz2-sz);
            }
            else if (9 == num)
            {
                sz = "%default%";
                length = 9;
            }
            else
            {
                sz = "";
                length = 0;
            }

            // search in the list of meshes whether we have one with this texture
            for (auto &mesh : (*curGroup).meshes)
            {
                if (length == mesh.name.length() && (length ? !::strcmp(sz, mesh.name.c_str()) : true))
                {
                    output = &mesh;
                    break;
                }
            }
            // if we don't have the mesh, create it
            if (!output)
            {
                (*curGroup).meshes.push_back(MeshInformation(std::string(sz,length)));
                output = &((*curGroup).meshes.back());
            }
            if (12 == num)
            {
                aiColor4D v(data[0],data[1],data[2],1.0f);
                output->colors.push_back(v);
                output->colors.push_back(v);
                output->colors.push_back(v);

                output->vertices.push_back(aiVector3D(data[3],data[4],data[5]));
                output->vertices.push_back(aiVector3D(data[6],data[7],data[8]));
                output->vertices.push_back(aiVector3D(data[9],data[10],data[11]));
            }
            else
            {
                output->vertices.push_back(aiVector3D(data[0],data[1],data[2]));
                output->vertices.push_back(aiVector3D(data[3],data[4],data[5]));
                output->vertices.push_back(aiVector3D(data[6],data[7],data[8]));
            }
        }
    }

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<RawRoot>");

    // count the number of valid groups
    // (meshes can't be empty)
    for (auto & outGroup : outGroups)
    {
        if (!outGroup.meshes.empty())
        {
            ++pScene->mRootNode->mNumChildren;
            pScene->mNumMeshes += (unsigned int) outGroup.meshes.size();
        }
    }

    if (!pScene->mNumMeshes)
    {
        throw DeadlyImportError("RAW: No meshes loaded. The file seems to be corrupt or empty.");
    }

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    aiNode** cc;
    if (1 == pScene->mRootNode->mNumChildren)
    {
        cc = &pScene->mRootNode;
        pScene->mRootNode->mNumChildren = 0;
    } else {
        cc = new aiNode*[pScene->mRootNode->mNumChildren];
        memset(cc, 0, sizeof(aiNode*) * pScene->mRootNode->mNumChildren);
        pScene->mRootNode->mChildren = cc;
    }

    pScene->mNumMaterials = pScene->mNumMeshes;
    aiMaterial** mats = pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];

    unsigned int meshIdx = 0;
    for (auto & outGroup : outGroups)
    {
        if (outGroup.meshes.empty())continue;

        aiNode* node;
        if (pScene->mRootNode->mNumChildren)
        {
            node = *cc = new aiNode();
            node->mParent = pScene->mRootNode;
        }
        else node = *cc;
        node->mName.Set(outGroup.name);

        // add all meshes
        node->mNumMeshes = (unsigned int) outGroup.meshes.size();
        unsigned int* pi = node->mMeshes = new unsigned int[ node->mNumMeshes ];
        for (std::vector< MeshInformation >::iterator it2 = outGroup.meshes.begin(),
            end2 = outGroup.meshes.end(); it2 != end2; ++it2)
        {
            ai_assert(!(*it2).vertices.empty());

            // allocate the mesh
            *pi++ = meshIdx;
            aiMesh* mesh = pScene->mMeshes[meshIdx] = new aiMesh();
            mesh->mMaterialIndex = meshIdx++;

            mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

            // allocate storage for the vertex components and copy them
            mesh->mNumVertices = (unsigned int)(*it2).vertices.size();
            mesh->mVertices = new aiVector3D[ mesh->mNumVertices ];
            ::memcpy(mesh->mVertices,&(*it2).vertices[0],sizeof(aiVector3D)*mesh->mNumVertices);

            if ((*it2).colors.size())
            {
                ai_assert((*it2).colors.size() == mesh->mNumVertices);

                mesh->mColors[0] = new aiColor4D[ mesh->mNumVertices ];
                ::memcpy(mesh->mColors[0],&(*it2).colors[0],sizeof(aiColor4D)*mesh->mNumVertices);
            }

            // generate triangles
            ai_assert(0 == mesh->mNumVertices % 3);
            aiFace* fc = mesh->mFaces = new aiFace[ mesh->mNumFaces = mesh->mNumVertices/3 ];
            aiFace* const fcEnd = fc + mesh->mNumFaces;
            unsigned int n = 0;
            while (fc != fcEnd)
            {
                aiFace& f = *fc++;
                f.mIndices = new unsigned int[f.mNumIndices = 3];
                for (unsigned int m = 0; m < 3;++m)
                    f.mIndices[m] = n++;
            }

            // generate a material for the mesh
            aiMaterial* mat = new aiMaterial();

            aiColor4D clr(1.0f,1.0f,1.0f,1.0f);
            if ("%default%" == (*it2).name) // a gray default material
            {
                clr.r = clr.g = clr.b = 0.6f;
            }
            else if ((*it2).name.length() > 0) // a texture
            {
                aiString s;
                s.Set((*it2).name);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
            }
            mat->AddProperty<aiColor4D>(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
            *mats++ = mat;
        }
    }
}